

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

ReaderFor<DynamicCapability> *
capnp::DynamicValue::Reader::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (ReaderFor<DynamicCapability> *__return_storage_ptr__,Reader *reader)

{
  Fault f;
  Fault local_18;
  
  if (reader->type == CAPABILITY) {
    (*(code *)((reader->field_1).structValue.reader.segment)->arena[4]._vptr_Arena)
              (__return_storage_ptr__);
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)(reader->field_1).listValue.reader.segment;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x71d,FAILED,"reader.type == CAPABILITY","\"Value type mismatch.\"",
               (char (*) [21])"Value type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x674e90;
    kj::_::Debug::Fault::~Fault(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

ReaderFor<DynamicCapability> DynamicValue::Reader::AsImpl<DynamicCapability>::apply(
    const Reader& reader) {
  KJ_REQUIRE(reader.type == CAPABILITY, "Value type mismatch.") {
    return DynamicCapability::Client();
  }
  return reader.capabilityValue;
}